

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyUtils.cpp
# Opt level: O0

bool isOperator(string *str)

{
  bool bVar1;
  bool local_11;
  string *str_local;
  
  bVar1 = std::operator==(str,"+");
  local_11 = true;
  if (!bVar1) {
    bVar1 = std::operator==(str,"-");
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator==(str,"*");
      local_11 = true;
      if (!bVar1) {
        bVar1 = std::operator==(str,"/");
        local_11 = true;
        if (!bVar1) {
          bVar1 = std::operator==(str,"<");
          local_11 = true;
          if (!bVar1) {
            bVar1 = std::operator==(str,">");
            local_11 = true;
            if (!bVar1) {
              bVar1 = std::operator==(str,"==");
              local_11 = true;
              if (!bVar1) {
                local_11 = std::operator==(str,"=");
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool isOperator(string str)
{
    return str == "+" || str == "-" || str == "*" || str == "/" ||
            str == "<" || str == ">" || str == "==" || str == "=";

}